

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureglyphcache.cpp
# Opt level: O0

void load_glyph_image_to_texture(QOpenGLContext *ctx,QImage *img,GLuint texture,int tx,int ty)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int g_00;
  int b_00;
  int iVar5;
  QRgb QVar6;
  quint32 qVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  GLsizei width;
  GLsizei width_00;
  undefined4 in_ECX;
  int in_ESI;
  GLenum in_R8D;
  long in_FS_OFFSET;
  GLenum format;
  GLenum fmt;
  int avg;
  int b;
  int g;
  int r;
  int x;
  QRgb *src;
  int y;
  int imgHeight;
  int imgWidth;
  QOpenGLFunctions *funcs;
  GLuint in_stack_ffffffffffffff08;
  ImageConversionFlag in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  Format in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  GLint in_stack_ffffffffffffff28;
  QFlagsStorage<Qt::ImageConversionFlag> in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  GLsizei height;
  undefined8 in_stack_ffffffffffffff50;
  GLenum in_stack_ffffffffffffff58;
  GLenum in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int local_7c;
  int local_6c;
  int local_5c;
  QImage local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = QOpenGLContext::functions();
  iVar2 = QImage::width();
  iVar3 = QImage::height();
  iVar4 = QImage::format();
  height = (GLsizei)in_stack_ffffffffffffff50;
  if (iVar4 == 1) {
    QFlags<Qt::ImageConversionFlag>::QFlags
              ((QFlags<Qt::ImageConversionFlag> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff0c);
    QImage::convertToFormat
              ((QImage *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff14,(ImageConversionFlags)in_stack_ffffffffffffff2c.i);
    QImage::operator=((QImage *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (QImage *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    QImage::~QImage(local_20);
  }
  else {
    iVar4 = QImage::depth();
    height = (GLsizei)in_stack_ffffffffffffff50;
    if (iVar4 == 0x20) {
      iVar4 = QImage::format();
      if (iVar4 != 4) {
        iVar4 = QImage::format();
        height = (GLsizei)in_stack_ffffffffffffff50;
        if (iVar4 != 6) goto LAB_001a4cee;
        uVar10 = QOpenGLContext::isOpenGLES();
        height = (GLsizei)in_stack_ffffffffffffff50;
        if ((uVar10 & 1) == 0) goto LAB_001a4cee;
      }
      for (local_5c = 0; height = (GLsizei)in_stack_ffffffffffffff50, local_5c < iVar3;
          local_5c = local_5c + 1) {
        lVar11 = QImage::scanLine(in_ESI);
        for (local_6c = 0; local_6c < iVar2; local_6c = local_6c + 1) {
          iVar4 = qRed(*(QRgb *)(lVar11 + (long)local_6c * 4));
          g_00 = qGreen(*(QRgb *)(lVar11 + (long)local_6c * 4));
          b_00 = qBlue(*(QRgb *)(lVar11 + (long)local_6c * 4));
          iVar5 = QImage::format();
          if (iVar5 == 4) {
            local_7c = (iVar4 + g_00 + b_00 + 1) / 3;
          }
          else {
            local_7c = qAlpha(*(QRgb *)(lVar11 + (long)local_6c * 4));
          }
          QVar6 = qRgba(iVar4,g_00,b_00,local_7c);
          *(QRgb *)(lVar11 + (long)local_6c * 4) = QVar6;
          uVar10 = QOpenGLContext::isOpenGLES();
          if ((uVar10 & 1) != 0) {
            qVar7 = ARGB2RGBA(0);
            *(quint32 *)(lVar11 + (long)local_6c * 4) = qVar7;
          }
        }
      }
    }
  }
LAB_001a4cee:
  QOpenGLFunctions::glBindTexture
            ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
  iVar2 = QImage::depth();
  if (iVar2 == 0x20) {
    bVar1 = QOpenGLContext::isOpenGLES();
    uVar8 = 0x80e1;
    if ((bVar1 & 1) != 0) {
      uVar8 = 0x1908;
    }
    QImage::constBits();
    QOpenGLFunctions::glTexSubImage2D
              ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (GLenum)((ulong)in_stack_ffffffffffffff30 >> 0x20),(GLint)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c.i,in_stack_ffffffffffffff28,width,(GLsizei)uVar9,
               in_stack_ffffffffffffff58,in_R8D,(GLvoid *)CONCAT44(uVar8,iVar3));
  }
  else {
    isCoreProfile();
    QImage::constBits();
    QOpenGLFunctions::glTexSubImage2D
              ((QOpenGLFunctions *)CONCAT44(in_ECX,in_stack_ffffffffffffff38),
               (GLenum)((ulong)uVar9 >> 0x20),(GLint)uVar9,in_stack_ffffffffffffff2c.i,
               in_stack_ffffffffffffff28,width_00,height,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff60,
               (GLvoid *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void load_glyph_image_to_texture(QOpenGLContext *ctx,
                                        QImage &img,
                                        GLuint texture,
                                        int tx, int ty)
{
    QOpenGLFunctions *funcs = ctx->functions();

    const int imgWidth = img.width();
    const int imgHeight = img.height();

    if (img.format() == QImage::Format_Mono) {
        img = img.convertToFormat(QImage::Format_Grayscale8);
    } else if (img.depth() == 32) {
        if (img.format() == QImage::Format_RGB32
            // We need to make the alpha component equal to the average of the RGB values.
            // This is needed when drawing sub-pixel antialiased text on translucent targets.
#if Q_BYTE_ORDER == Q_BIG_ENDIAN
            || img.format() == QImage::Format_ARGB32_Premultiplied
#else
            || (img.format() == QImage::Format_ARGB32_Premultiplied
                && ctx->isOpenGLES())
#endif
            ) {
            for (int y = 0; y < imgHeight; ++y) {
                QRgb *src = (QRgb *) img.scanLine(y);
                for (int x = 0; x < imgWidth; ++x) {
                    int r = qRed(src[x]);
                    int g = qGreen(src[x]);
                    int b = qBlue(src[x]);
                    int avg;
                    if (img.format() == QImage::Format_RGB32)
                        avg = (r + g + b + 1) / 3; // "+1" for rounding.
                    else // Format_ARGB_Premultiplied
                        avg = qAlpha(src[x]);

                    src[x] = qRgba(r, g, b, avg);
                    // swizzle the bits to accommodate for the GL_RGBA upload.
#if Q_BYTE_ORDER != Q_BIG_ENDIAN
                    if (ctx->isOpenGLES())
#endif
                        src[x] = ARGB2RGBA(src[x]);
                }
            }
        }
    }

    funcs->glBindTexture(GL_TEXTURE_2D, texture);
    if (img.depth() == 32) {
#if QT_CONFIG(opengles2)
        GLenum fmt = GL_RGBA;
#else
        GLenum fmt = ctx->isOpenGLES() ? GL_RGBA : GL_BGRA;
#endif // QT_CONFIG(opengles2)

#if Q_BYTE_ORDER == Q_BIG_ENDIAN
        fmt = GL_RGBA;
#endif
        funcs->glTexSubImage2D(GL_TEXTURE_2D, 0, tx, ty, imgWidth, imgHeight, fmt, GL_UNSIGNED_BYTE, img.constBits());
    } else {
        // The scanlines in image are 32-bit aligned, even for mono or 8-bit formats. This
        // is good because it matches the default of 4 bytes for GL_UNPACK_ALIGNMENT.
#if !QT_CONFIG(opengles2)
        const GLenum format = isCoreProfile() ? GL_RED : GL_ALPHA;
#else
        const GLenum format = GL_ALPHA;
#endif
        funcs->glTexSubImage2D(GL_TEXTURE_2D, 0, tx, ty, imgWidth, imgHeight, format, GL_UNSIGNED_BYTE, img.constBits());
    }
}